

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O1

shared_ptr<Image> runEnhanceStage(Image *previous,Histogram *hist,WaterEffectOptions *options)

{
  Image *this;
  int iVar1;
  long *plVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Image> sVar5;
  Histogram enhanced_hist;
  shared_ptr<Image> enhanced_hist_img;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Image *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((options != (WaterEffectOptions *)0x0) && ((char)in_RCX[1]._M_string_length != '\0')) {
    iVar1 = Histogram::max((Histogram *)options,0);
    iVar1 = (int)((double)iVar1 * 0.1);
    previous->pixels = (Pixel *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Image,std::allocator<Image>,unsigned_int_const&,unsigned_int_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&previous->raw,(Image **)previous,
               (allocator<Image> *)&local_a0,(uint *)(hist + 1),(uint *)&hist[1].range);
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,0);
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,1);
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,2);
    copyChannel((Image *)hist,(Image *)previous->pixels,3);
    _Var4._M_pi = extraout_RDX;
    if (in_RCX[1].field_2._M_local_buf[0] == '\x01') {
      this = (Image *)previous->pixels;
      std::operator+(&local_80,"output/",in_RCX);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_a0.field_2._M_allocated_capacity = *psVar3;
        local_a0.field_2._8_8_ = plVar2[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar3;
        local_a0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_a0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Image::toPNG(this,&local_a0);
      _Var4._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_02;
      }
    }
    if (*(char *)((long)&in_RCX[1]._M_string_length + 2) == '\x01') {
      getHistogram((Histogram *)&local_a0,(Image *)previous->pixels);
      Histogram::toImage((Histogram *)&local_60,(uint)&local_a0);
      std::operator+(&local_50,"output/",in_RCX);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_80.field_2._M_allocated_capacity = *psVar3;
        local_80.field_2._8_8_ = plVar2[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar3;
        local_80._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_80._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Image::toPNG(local_60,&local_80);
      _Var4._M_pi = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        _Var4._M_pi = extraout_RDX_05;
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        _Var4._M_pi = extraout_RDX_06;
      }
      if ((void *)local_a0._M_string_length != (void *)0x0) {
        operator_delete((void *)local_a0._M_string_length);
        _Var4._M_pi = extraout_RDX_07;
      }
    }
    sVar5.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
    sVar5.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = previous;
    return (shared_ptr<Image>)sVar5.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "Contrast enhancement is only possible when histogram stage has been performed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> runEnhanceStage(const Image *previous,
                                       const Histogram *hist,
                                       const WaterEffectOptions *options) {
  // Check if histogram stage has been properly executed.
  if ((!options->histogram) || (hist == nullptr)) {
    throw std::runtime_error("Contrast enhancement is only possible when histogram stage has been performed.");
  }

  // Determine the threshold from the histogram, by taking 10% of the maximum value in the histogram.
  auto threshold = (int) (hist->max(0) * 0.1);

  // Create a new image to store the result
  auto img_enhanced = std::make_shared<Image>(previous->width, previous->height);

  // Enhance the contrast on the color channels
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 0);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 1);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 2);

  // Copy over the alpha channel
  copyChannel(previous, img_enhanced.get(), 3);

  // Save the resulting image
  if (options->save_intermediate)
    img_enhanced->toPNG("output/" + options->img_name + "_enhanced.png");

  // Set the previous image to point to the enhanced image for next stages.
  previous = img_enhanced.get();

  // Create and save the enhanced histogram (if enabled).
  if (options->enhance_hist) {
    auto enhanced_hist = getHistogram(img_enhanced.get());
    auto enhanced_hist_img = enhanced_hist.toImage();
    enhanced_hist_img->toPNG("output/" + options->img_name + "_enhanced_histogram.png");
  }

  return img_enhanced;
}